

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<int> * __thiscall
cmJSONHelperBuilder::Required<int,std::function<bool(int&,Json::Value_const*,cmJSONState*)>>
          (cmJSONHelper<int> *__return_storage_ptr__,cmJSONHelperBuilder *this,ErrorGenerator *error
          ,function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *func)

{
  anon_class_64_2_4751a9fd local_60;
  ErrorGenerator *local_20;
  function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *func_local;
  ErrorGenerator *error_local;
  
  local_20 = error;
  func_local = (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)this;
  error_local = (ErrorGenerator *)__return_storage_ptr__;
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::function
            (&local_60.error,(function<void_(const_Json::Value_*,_cmJSONState_*)> *)this);
  std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
            (&local_60.func,(function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)error);
  std::function<bool(int&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::Required<int,std::function<bool(int&,Json::Value_const*,cmJSONState*)>>(std::function<void(Json::Value_const*,cmJSONState*)>const&,std::function<bool(int&,Json::Value_const*,cmJSONState*)>)::_lambda(int&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(int&,Json::Value_const*,cmJSONState*)> *)__return_storage_ptr__,
             &local_60);
  Required<int,std::function<bool(int&,Json::Value_const*,cmJSONState*)>>(std::function<void(Json::Value_const*,cmJSONState*)>const&,std::function<bool(int&,Json::Value_const*,cmJSONState*)>)
  ::{lambda(int&,Json::Value_const*,cmJSONState*)#1}::~Required
            ((_lambda_int__Json__Value_const__cmJSONState___1_ *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<T> Required(const JsonErrors::ErrorGenerator& error,
                                  F func)
  {
    return [error, func](T& out, const Json::Value* value,
                         cmJSONState* state) -> bool {
      if (!value) {
        error(value, state);
        ;
        return false;
      }
      return func(out, value, state);
    };
  }